

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O3

void __thiscall PythonModuleClient::recv_file_close(PythonModuleClient *this)

{
  undefined4 uVar1;
  int iVar2;
  long *in_RAX;
  long *plVar3;
  override recv_file_close;
  long *local_18;
  
  local_18 = in_RAX;
  uVar1 = PyGILState_Ensure();
  boost::python::converter::registration::get_class_object
            (boost::python::converter::detail::registered_base<AbstractModuleClient_const_volatile&>
             ::converters);
  boost::python::detail::wrapper_base::get_override
            ((char *)&local_18,(_typeobject *)&this->super_wrapper<AbstractModuleClient>);
  iVar2 = PyObject_IsTrue(local_18);
  if (iVar2 < 0) {
    boost::python::throw_error_already_set();
  }
  else if (iVar2 == 0) {
    *local_18 = *local_18 + -1;
    if (*local_18 == 0) {
      _Py_Dealloc();
    }
    goto LAB_00242738;
  }
  plVar3 = (long *)PyEval_CallFunction(local_18,"()");
  if (plVar3 == (long *)0x0) {
    boost::python::throw_error_already_set();
  }
  else {
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      _Py_Dealloc(plVar3);
    }
  }
  *local_18 = *local_18 + -1;
  if (*local_18 == 0) {
    _Py_Dealloc();
  }
LAB_00242738:
  PyGILState_Release(uVar1);
  return;
}

Assistant:

void recv_file_close(){
        PyLockGIL lock;
        if(override recv_file_close = this->get_override("recv_file_close")){
            try{
                recv_file_close();
            }
            catch (const error_already_set&){
                std::cout << "Exception in recv_file_close in application";
                PyErr_Print();
            }
            return;
        }
        AbstractModuleClient::recv_file_close();
    }